

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Scene::selectHalfedge(Scene *this)

{
  HalfedgeIter *pHVar1;
  Halfedge *pHVar2;
  long in_RDI;
  HalfedgeIter h;
  Vertex *v;
  Edge *e;
  Face *f;
  HalfedgeElement *in_stack_ffffffffffffffd0;
  _List_iterator<CMU462::Halfedge> local_28;
  Vertex *local_20;
  Edge *local_18;
  Face *local_10;
  
  if (*(long *)(in_RDI + 0x38) != 0) {
    local_10 = HalfedgeElement::getFace(in_stack_ffffffffffffffd0);
    local_18 = HalfedgeElement::getEdge(in_stack_ffffffffffffffd0);
    local_20 = HalfedgeElement::getVertex(in_stack_ffffffffffffffd0);
    std::_List_iterator<CMU462::Halfedge>::_List_iterator(&local_28);
    if (local_10 == (Face *)0x0) {
      if (local_18 == (Edge *)0x0) {
        if (local_20 == (Vertex *)0x0) {
          return;
        }
        pHVar1 = Vertex::halfedge(local_20);
        local_28._M_node = pHVar1->_M_node;
      }
      else {
        pHVar1 = Edge::halfedge(local_18);
        local_28._M_node = pHVar1->_M_node;
      }
    }
    else {
      pHVar1 = Face::halfedge(local_10);
      local_28._M_node = pHVar1->_M_node;
    }
    pHVar2 = elementAddress((HalfedgeIter)0x20dcf1);
    *(Halfedge **)(in_RDI + 0x38) = pHVar2;
  }
  return;
}

Assistant:

void Scene::selectHalfedge() {
  if (selected.element) {
    Face *f = selected.element->getFace();
    Edge *e = selected.element->getEdge();
    Vertex *v = selected.element->getVertex();
    HalfedgeIter h;
    if (f != nullptr) {
      h = f->halfedge();
    } else if (e != nullptr) {
      h = e->halfedge();
    } else if (v != nullptr) {
      h = v->halfedge();
    } else {
      return;
    }
    selected.element = elementAddress(h);
  }
}